

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O0

void __thiscall
Diligent::GLProgram::SetResources
          (GLProgram *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pResources)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  shared_ptr<const_Diligent::ShaderResourcesGL> *pResources_local;
  GLProgram *this_local;
  
  msg.field_2._8_8_ = pResources;
  if (this->m_LinkStatus != Succeeded) {
    FormatString<char[53]>
              ((string *)local_38,
               (char (*) [53])"Program must be successfully linked to set resources");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0xa4);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pResources);
  if (bVar1) {
    bVar1 = std::operator==(&this->m_pResources,pResources);
    if (!bVar1) {
      FormatString<char[97]>
                ((string *)local_68,
                 (char (*) [97])
                 "Assigning different resources. This should not happen as cached programs are keyed by shader IDs"
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0xab);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  else {
    std::shared_ptr<const_Diligent::ShaderResourcesGL>::operator=(&this->m_pResources,pResources);
  }
  return;
}

Assistant:

void GLProgram::SetResources(std::shared_ptr<const ShaderResourcesGL> pResources)
{
    DEV_CHECK_ERR(m_LinkStatus == LinkStatus::Succeeded, "Program must be successfully linked to set resources");
    if (!m_pResources)
    {
        m_pResources = std::move(pResources);
    }
    else
    {
        VERIFY(m_pResources == pResources, "Assigning different resources. This should not happen as cached programs are keyed by shader IDs");
    }
}